

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * ae_fflagstostr(unsigned_long bitset,unsigned_long bitclear)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  size_t local_50;
  size_t length;
  flag *flag;
  unsigned_long bits;
  char *sp;
  char *dp;
  char *string;
  unsigned_long bitclear_local;
  unsigned_long bitset_local;
  
  flag = (flag *)(bitset | bitclear);
  local_50 = 0;
  for (length = (size_t)flags; *(long *)length != 0; length = length + 0x20) {
    if (((ulong)flag & (*(ulong *)(length + 0x10) | *(ulong *)(length + 0x18))) != 0) {
      sVar3 = strlen(*(char **)length);
      local_50 = sVar3 + 1 + local_50;
      flag = (flag *)(((*(ulong *)(length + 0x10) | *(ulong *)(length + 0x18)) ^ 0xffffffffffffffff)
                     & (ulong)flag);
    }
  }
  if (local_50 == 0) {
    bitset_local = 0;
  }
  else {
    bitset_local = (unsigned_long)malloc(local_50);
    if ((char *)bitset_local == (char *)0x0) {
      bitset_local = 0;
    }
    else {
      sp = (char *)bitset_local;
      string = (char *)bitclear;
      bitclear_local = bitset;
      for (length = (size_t)flags; *(long *)length != 0; length = length + 0x20) {
        if (((bitclear_local & *(ulong *)(length + 0x10)) == 0) &&
           (((ulong)string & *(ulong *)(length + 0x18)) == 0)) {
          if (((bitclear_local & *(ulong *)(length + 0x18)) != 0) ||
             (((ulong)string & *(ulong *)(length + 0x10)) != 0)) {
            bits = *(unsigned_long *)length;
            goto LAB_007a62ed;
          }
        }
        else {
          bits = *(long *)length + 2;
LAB_007a62ed:
          bitclear_local =
               ((*(ulong *)(length + 0x10) | *(ulong *)(length + 0x18)) ^ 0xffffffffffffffff) &
               bitclear_local;
          string = (char *)(((*(ulong *)(length + 0x10) | *(ulong *)(length + 0x18)) ^
                            0xffffffffffffffff) & (ulong)string);
          pcVar2 = sp;
          if (bitset_local < sp) {
            *sp = ',';
            pcVar2 = sp + 1;
          }
          do {
            sp = pcVar2;
            cVar1 = *(char *)bits;
            *sp = cVar1;
            bits = bits + 1;
            pcVar2 = sp + 1;
          } while (cVar1 != '\0');
        }
      }
      *sp = '\0';
    }
  }
  return (char *)bitset_local;
}

Assistant:

static char *
ae_fflagstostr(unsigned long bitset, unsigned long bitclear)
{
	char *string, *dp;
	const char *sp;
	unsigned long bits;
	struct flag *flag;
	size_t	length;

	bits = bitset | bitclear;
	length = 0;
	for (flag = flags; flag->name != NULL; flag++)
		if (bits & (flag->set | flag->clear)) {
			length += strlen(flag->name) + 1;
			bits &= ~(flag->set | flag->clear);
		}

	if (length == 0)
		return (NULL);
	string = (char *)malloc(length);
	if (string == NULL)
		return (NULL);

	dp = string;
	for (flag = flags; flag->name != NULL; flag++) {
		if (bitset & flag->set || bitclear & flag->clear) {
			sp = flag->name + 2;
		} else if (bitset & flag->clear  ||  bitclear & flag->set) {
			sp = flag->name;
		} else
			continue;
		bitset &= ~(flag->set | flag->clear);
		bitclear &= ~(flag->set | flag->clear);
		if (dp > string)
			*dp++ = ',';
		while ((*dp++ = *sp++) != '\0')
			;
		dp--;
	}

	*dp = '\0';
	return (string);
}